

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesFabricPortGetThroughput(zes_fabric_port_handle_t hPort,zes_fabric_port_throughput_t *pThroughput)

{
  zes_pfnFabricPortGetThroughput_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFabricPortGetThroughput_t pfnGetThroughput;
  zes_fabric_port_throughput_t *pThroughput_local;
  zes_fabric_port_handle_t hPort_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->FabricPort).pfnGetThroughput;
    if (p_Var1 == (zes_pfnFabricPortGetThroughput_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hPort_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hPort_local._4_4_ = (*p_Var1)(hPort,pThroughput);
    }
  }
  else {
    hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hPort_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFabricPortGetThroughput(
    zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
    zes_fabric_port_throughput_t* pThroughput       ///< [in,out] Will contain the Fabric port throughput counters.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFabricPortGetThroughput_t pfnGetThroughput = [&result] {
        auto pfnGetThroughput = ze_lib::context->zesDdiTable.load()->FabricPort.pfnGetThroughput;
        if( nullptr == pfnGetThroughput ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetThroughput;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetThroughput( hPort, pThroughput );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetThroughput = ze_lib::context->zesDdiTable.load()->FabricPort.pfnGetThroughput;
    if( nullptr == pfnGetThroughput ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetThroughput( hPort, pThroughput );
    #endif
}